

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

char * ShGetInfoLog(ShHandle handle)

{
  long lVar1;
  long *plVar2;
  TInfoSinkBase *this;
  
  if (handle == (ShHandle)0x0) {
    return (char *)0x0;
  }
  lVar1 = (**(code **)(*handle + 0x10))();
  if (lVar1 == 0) {
    lVar1 = (**(code **)(*handle + 0x18))(handle);
    if (lVar1 == 0) {
      return (char *)0x0;
    }
    plVar2 = (long *)(**(code **)(*handle + 0x18))(handle);
    this = (TInfoSinkBase *)(**(code **)(*plVar2 + 0x70))(plVar2);
  }
  else {
    plVar2 = (long *)(**(code **)(*handle + 0x10))(handle);
    this = (TInfoSinkBase *)(**(code **)(*plVar2 + 0x30))(plVar2);
  }
  glslang::TInfoSinkBase::append(this,this[1].sink._M_dataplus._M_p);
  return (this->sink)._M_dataplus._M_p;
}

Assistant:

const char* ShGetInfoLog(const ShHandle handle)
{
    if (handle == nullptr)
        return nullptr;

    TShHandleBase* base = static_cast<TShHandleBase*>(handle);
    TInfoSink* infoSink;

    if (base->getAsCompiler())
        infoSink = &(base->getAsCompiler()->getInfoSink());
    else if (base->getAsLinker())
        infoSink = &(base->getAsLinker()->getInfoSink());
    else
        return nullptr;

    infoSink->info << infoSink->debug.c_str();
    return infoSink->info.c_str();
}